

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  Mat *this_00;
  uint uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  float *pfVar13;
  ulong uVar14;
  pointer pBVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  pointer pMVar23;
  ulong uVar24;
  int i;
  float *pfVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float extraout_XMM0_Db;
  undefined1 auVar34 [16];
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_158;
  float *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float local_78;
  float fStack_74;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar22 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar22) {
      Yolov3DetectionOutput::qsort_descent_inplace
                (&this->super_Yolov3DetectionOutput,&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                (&this->super_Yolov3DetectionOutput,&all_bbox_rects,&picked,
                 (this->super_Yolov3DetectionOutput).nms_threshold);
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar22 = 0;
          uVar22 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar22 = uVar22 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar22]);
      }
      uVar22 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar26 = (int)uVar22;
      if (iVar26 == 0) {
        iVar12 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar26,4,opt->blob_allocator);
        pvVar5 = this_00->data;
        iVar12 = -100;
        if ((pvVar5 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar12 = 0;
          uVar22 = uVar22 & 0xffffffff;
          if (iVar26 < 1) {
            uVar22 = 0;
          }
          pBVar15 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
            fVar2 = pBVar15->score;
            lVar21 = (long)this_00->w * uVar19 * this_00->elemsize;
            *(float *)((long)pvVar5 + lVar21) = (float)pBVar15->label + 1.0;
            *(float *)((long)pvVar5 + lVar21 + 4) = fVar2;
            *(float *)((long)pvVar5 + lVar21 + 8) = pBVar15->xmin;
            *(float *)((long)pvVar5 + lVar21 + 0xc) = pBVar15->ymin;
            *(float *)((long)pvVar5 + lVar21 + 0x10) = pBVar15->xmax;
            *(float *)((long)pvVar5 + lVar21 + 0x14) = pBVar15->ymax;
            pBVar15 = pBVar15 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003fc54e:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar12;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,(long)(this->super_Yolov3DetectionOutput).num_box);
    pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar26 = (this->super_Yolov3DetectionOutput).num_box;
    iVar12 = pMVar23[uVar22].c / iVar26;
    if (iVar12 != (this->super_Yolov3DetectionOutput).num_class + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar12 = -1;
      goto LAB_003fc54e;
    }
    pMVar23 = pMVar23 + uVar22;
    lVar21 = (long)iVar26;
    uVar19._0_4_ = pMVar23->w;
    uVar19._4_4_ = pMVar23->h;
    fVar2 = *(float *)((long)(this->super_Yolov3DetectionOutput).anchors_scale.data + uVar22 * 4);
    uVar16 = 0;
    if (0 < (int)(undefined4)uVar19) {
      uVar16 = uVar19 & 0xffffffff;
    }
    uVar7 = uVar19._4_4_;
    if ((int)uVar19._4_4_ < 1) {
      uVar7 = 0;
    }
    auVar34._4_4_ = (float)(int)uVar19._4_4_;
    auVar34._0_4_ = (float)(int)(undefined4)uVar19;
    auVar34._8_4_ = 0x3f000000;
    auVar34._12_4_ = 0x3f000000;
    auVar34 = divps(_DAT_00536230,auVar34);
    for (lVar17 = 0; lVar17 < iVar26; lVar17 = lVar17 + 1) {
      lVar27 = lVar17 * iVar12;
      sVar4 = pMVar23->cstep;
      pvVar5 = pMVar23->data;
      uVar6 = pMVar23->elemsize;
      uVar3 = *(undefined8 *)
               ((long)(this->super_Yolov3DetectionOutput).biases.data +
               (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput).mask.data +
                                     lVar17 * 4 + lVar21 * uVar22 * 4) * 2) * 4);
      local_150 = (float *)(sVar4 * lVar27 * uVar6 + (long)pvVar5);
      local_158 = (float *)((lVar27 + 1) * sVar4 * uVar6 + (long)pvVar5);
      pfVar20 = (float *)((lVar27 + 2) * sVar4 * uVar6 + (long)pvVar5);
      pfVar18 = (float *)((lVar27 + 3) * sVar4 * uVar6 + (long)pvVar5);
      pfVar25 = (float *)((lVar27 + 4) * sVar4 * uVar6 + (long)pvVar5);
      lVar28 = (long)(int)(((long)pMVar23->d * uVar6 * (long)pMVar23->h * (long)pMVar23->w + 0xf &
                           0xfffffffffffffff0) / uVar6);
      for (uVar14 = 0; uVar14 != uVar7; uVar14 = uVar14 + 1) {
        for (uVar24 = 0; uVar24 != uVar16; uVar24 = uVar24 + 1) {
          pfVar13 = (float *)((long)pvVar5 +
                             uVar24 * 4 +
                             uVar14 * (long)(int)(undefined4)uVar19 * 4 +
                             (lVar27 + 5) * sVar4 * uVar6);
          pfVar1 = pfVar13 + (this->super_Yolov3DetectionOutput).num_class * lVar28;
          fVar30 = -3.4028235e+38;
          for (; pfVar13 < pfVar1; pfVar13 = pfVar13 + lVar28) {
            if (fVar30 <= *pfVar13) {
              fVar30 = *pfVar13;
            }
          }
          fVar29 = expf(-*pfVar25);
          fVar30 = expf(-fVar30);
          fVar30 = 1.0 / ((fVar30 + 1.0) * fVar29 + 1.0);
          if ((this->super_Yolov3DetectionOutput).confidence_threshold <= fVar30) {
            fVar29 = *local_158;
            fVar31 = expf(-*local_150);
            fVar29 = expf(-fVar29);
            fVar32 = expf(*pfVar20);
            fVar33 = expf(*pfVar18);
            auVar8._8_4_ = extraout_XMM0_Db_01;
            auVar8._4_4_ = fVar32;
            auVar8._0_4_ = extraout_XMM0_Db_02;
            auVar35._0_8_ = auVar8._0_8_ << 0x20;
            auVar35._8_4_ = fVar32;
            auVar35._12_4_ = fVar33;
            auVar11._8_8_ = uVar3;
            auVar11._0_8_ = 0x3f8000003f800000;
            auVar10._4_4_ = fVar29 + 1.0;
            auVar10._0_4_ = fVar31 + 1.0;
            auVar10._8_4_ = extraout_XMM0_Db + 0.0;
            auVar10._12_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar38 = divps(auVar11,auVar10);
            auVar9._4_8_ = auVar35._8_8_;
            auVar9._0_4_ = extraout_XMM0_Db_02 * 1.0;
            auVar36._0_8_ = auVar9._0_8_ << 0x20;
            auVar36._8_4_ = fVar32 * (float)uVar3;
            auVar36._12_4_ = fVar33 * (float)((ulong)uVar3 >> 0x20);
            auVar37._8_8_ = auVar36._8_8_;
            auVar37._0_8_ = auVar38._0_8_;
            local_78 = auVar34._0_4_;
            fStack_74 = auVar34._4_4_;
            local_78 = (auVar38._0_4_ + (float)(int)uVar24) * local_78;
            fStack_74 = (auVar38._4_4_ + (float)(int)uVar14) * fStack_74;
            auVar38._4_4_ = (float)(int)uVar14;
            auVar38._0_4_ = (float)(int)uVar24;
            auVar38._8_4_ = (float)(int)(fVar2 * (float)(int)(undefined4)uVar19);
            auVar38._12_4_ = (float)(int)(fVar2 * (float)(int)uVar19._4_4_);
            auVar38 = divps(auVar37,auVar38);
            fVar29 = auVar38._8_4_ * 0.5;
            fVar31 = auVar38._12_4_ * 0.5;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(local_78 - fVar29,fVar30);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_78 + fVar29,fStack_74 - fVar31);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(auVar38._8_4_ * auVar38._12_4_,fStack_74 + fVar31);
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar17 * 6),
                        (value_type *)&picked);
          }
          local_150 = local_150 + 1;
          local_158 = local_158 + 1;
          pfVar20 = pfVar20 + 1;
          pfVar18 = pfVar18 + 1;
          pfVar25 = pfVar25 + 1;
        }
      }
      iVar26 = (this->super_Yolov3DetectionOutput).num_box;
    }
    lVar21 = 8;
    for (lVar17 = 0; lVar17 < iVar26; lVar17 = lVar17 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar21));
      iVar26 = (this->super_Yolov3DetectionOutput).num_box;
      lVar21 = lVar21 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}